

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

string * __thiscall
wasm::Pass::getArgument
          (string *__return_storage_ptr__,Pass *this,string *key,string *errorTextIfMissing)

{
  bool bVar1;
  __type_conflict _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  PassOptions *this_00;
  string local_208;
  byte local_1e1;
  string local_1e0;
  Fatal local_1b0;
  string *local_28;
  string *errorTextIfMissing_local;
  string *key_local;
  Pass *this_local;
  
  local_28 = errorTextIfMissing;
  errorTextIfMissing_local = key;
  key_local = (string *)this;
  this_local = (Pass *)__return_storage_ptr__;
  bVar1 = hasArgument(this,key);
  if (!bVar1) {
    Fatal::Fatal(&local_1b0);
    Fatal::operator<<(&local_1b0,local_28);
    Fatal::~Fatal(&local_1b0);
  }
  _Var2 = std::operator==(errorTextIfMissing_local,&this->name);
  local_1e1 = 0;
  if (_Var2) {
    pbVar3 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&this->passArg);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar3);
  }
  else {
    this_00 = getPassOptions(this);
    std::__cxx11::string::string((string *)&local_1e0,(string *)errorTextIfMissing_local);
    local_1e1 = 1;
    std::__cxx11::string::string((string *)&local_208,(string *)local_28);
    PassOptions::getArgument(__return_storage_ptr__,this_00,&local_1e0,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
  }
  if ((local_1e1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Pass::getArgument(const std::string& key,
                              const std::string& errorTextIfMissing) {
  if (!hasArgument(key)) {
    Fatal() << errorTextIfMissing;
  }

  return (key == name) ? *passArg
                       : getPassOptions().getArgument(key, errorTextIfMissing);
}